

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ParseShaderParameter
          (ConversionStream *this,iterator *Token,ShaderParameterInfo *ParamInfo)

{
  uint uVar1;
  TokenListType *this_00;
  String *Args;
  bool bVar2;
  __type _Var3;
  _List_node_base *p_Var4;
  iterator iVar5;
  iterator iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_1;
  iterator iVar7;
  int iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  iterator TypeToken;
  string err_15;
  string err;
  string local_70;
  String local_50;
  
  this_00 = &this->m_Tokens;
  p_Var4 = Token->_M_node;
  if (p_Var4 == (_List_node_base *)this_00) {
    FormatString<char[43]>(&err,(char (*) [43])"Unexpected EOF while parsing argument list");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&err_15,this,Token,4);
    in_R8 = &err;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ParseShaderParameter",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x926,in_R8,(char (*) [2])0x2c8293,&err_15);
    std::__cxx11::string::~string((string *)&err_15);
    std::__cxx11::string::~string((string *)&err);
    p_Var4 = Token->_M_node;
  }
  bVar2 = ShaderParameterInfo::SetInterpolationQualifier(ParamInfo,*(TokenType *)&p_Var4[1]._M_next)
  ;
  TypeToken._M_node = Token->_M_node;
  if (bVar2) {
    TypeToken = std::__cxx11::
                list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                ::erase(this_00,TypeToken._M_node);
    Token->_M_node = (_List_node_base *)TypeToken;
    if (TypeToken._M_node == (_List_node_base *)this_00) {
      FormatString<char[43]>(&err,(char (*) [43])"Unexpected EOF while parsing argument list");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&err_15,this,Token,4)
      ;
      in_R8 = &err;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x92f,in_R8,(char (*) [2])0x2c8293,&err_15);
      std::__cxx11::string::~string((string *)&err_15);
      std::__cxx11::string::~string((string *)&err);
      TypeToken = (iterator)Token->_M_node;
    }
  }
  uVar1 = *(int *)&TypeToken._M_node[1]._M_next - 1;
  Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)CONCAT31((int3)(uVar1 >> 8),uVar1 < 0xbf);
  if (*(int *)&TypeToken._M_node[1]._M_next != 0x13b && uVar1 >= 0xbf) {
    FormatString<char[22]>(&err,(char (*) [22])"Missing argument type");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&err_15,this,Token,4);
    in_R8 = &err;
    Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x933;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ParseShaderParameter",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x933,in_R8,(char (*) [2])0x2c8293,&err_15);
    std::__cxx11::string::~string((string *)&err_15);
    std::__cxx11::string::~string((string *)&err);
    TypeToken = (iterator)Token->_M_node;
  }
  std::__cxx11::string::_M_assign((string *)&ParamInfo->Type);
  if (ParamInfo->storageQualifier != Ret) {
    p_Var4 = Token->_M_node->_M_next;
    Token->_M_node = p_Var4;
    if (p_Var4 == (_List_node_base *)this_00) {
      FormatString<char[43]>(&err,(char (*) [43])"Unexpected EOF while parsing argument list");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&err_15,this,Token,4)
      ;
      in_R8 = &err;
      Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x93c;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x93c,in_R8,(char (*) [2])0x2c8293,&err_15);
      std::__cxx11::string::~string((string *)&err_15);
      std::__cxx11::string::~string((string *)&err);
      p_Var4 = Token->_M_node;
    }
    if (*(int *)&p_Var4[1]._M_next != 0x13b) {
      FormatString<char[29],std::__cxx11::string>
                (&err,(Diligent *)"Missing argument name after ",(char (*) [29])&ParamInfo->Type,
                 Args_1);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&err_15,this,Token,4)
      ;
      in_R8 = &err;
      Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x93d;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x93d,in_R8,(char (*) [2])0x2c8293,&err_15);
      std::__cxx11::string::~string((string *)&err_15);
      std::__cxx11::string::~string((string *)&err);
    }
    Args = &ParamInfo->Name;
    std::__cxx11::string::_M_assign((string *)Args);
    p_Var4 = Token->_M_node->_M_next;
    Token->_M_node = p_Var4;
    if (p_Var4 == (_List_node_base *)this_00) {
      FormatString<char[15]>(&err,(char (*) [15])"Unexpected EOF");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&err_15,this,Token,4)
      ;
      in_R8 = &err;
      Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x941;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x941,in_R8,(char (*) [2])0x2c8293,&err_15);
      std::__cxx11::string::~string((string *)&err_15);
      std::__cxx11::string::~string((string *)&err);
      p_Var4 = Token->_M_node;
    }
    if (*(int *)&p_Var4[1]._M_next == 0x137) {
      iVar8 = 1;
      while( true ) {
        p_Var4 = p_Var4->_M_next;
        Token->_M_node = p_Var4;
        if (p_Var4 == (_List_node_base *)this_00) break;
        if (*(int *)&p_Var4[1]._M_next == 0x138) {
          if (iVar8 < 2) goto LAB_001c5ac3;
          iVar8 = iVar8 + -1;
        }
        else if (*(int *)&p_Var4[1]._M_next == 0x137) {
          iVar8 = iVar8 + 1;
        }
        std::__cxx11::string::append((string *)&ParamInfo->ArraySize);
        std::__cxx11::string::append((string *)&ParamInfo->ArraySize);
        p_Var4 = Token->_M_node;
      }
      FormatString<char[38]>(&err,(char (*) [38])"Unexpected EOF while processing scope");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&err_15,this,Token,4)
      ;
      in_R8 = &err;
      Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd1e;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessScope",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xd1e,in_R8,(char (*) [2])0x2c8293,&err_15);
      std::__cxx11::string::~string((string *)&err_15);
      std::__cxx11::string::~string((string *)&err);
      p_Var4 = Token->_M_node;
      if (*(int *)&p_Var4[1]._M_next != 0x138) {
        FormatString<char[26],char[32]>
                  (&err,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Token->Type == ClosingParenType",(char (*) [32])Args_1);
        Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd1f;
        DebugAssertionFailed
                  ((Char *)CONCAT44(err._M_dataplus._M_p._4_4_,err._M_dataplus._M_p._0_4_),
                   "ProcessScope",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0xd1f);
        std::__cxx11::string::~string((string *)&err);
        p_Var4 = Token->_M_node;
      }
LAB_001c5ac3:
      if (p_Var4 == (_List_node_base *)this_00) {
        FormatString<char[15]>(&err,(char (*) [15])"Unexpected EOF");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&err_15,this,Token,4);
        in_R8 = &err;
        Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x94f;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseShaderParameter",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x94f,in_R8,(char (*) [2])0x2c8293,&err_15);
        std::__cxx11::string::~string((string *)&err_15);
        std::__cxx11::string::~string((string *)&err);
        p_Var4 = Token->_M_node;
      }
      if (*(int *)&p_Var4[1]._M_next != 0x138) {
        FormatString<char[24]>(&err,(char (*) [24])"Closing staple expected");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&err_15,this,Token,4);
        in_R8 = &err;
        Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x952;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseShaderParameter",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x952,in_R8,(char (*) [2])0x2c8293,&err_15);
        std::__cxx11::string::~string((string *)&err_15);
        std::__cxx11::string::~string((string *)&err);
        p_Var4 = Token->_M_node;
      }
      p_Var4 = p_Var4->_M_next;
      Token->_M_node = p_Var4;
      if (p_Var4 == (_List_node_base *)this_00) {
        FormatString<char[15]>(&err,(char (*) [15])"Unexpected EOF");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&err_15,this,Token,4);
        in_R8 = &err;
        Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x955;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseShaderParameter",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x955,in_R8,(char (*) [2])0x2c8293,&err_15);
        std::__cxx11::string::~string((string *)&err_15);
        std::__cxx11::string::~string((string *)&err);
        p_Var4 = Token->_M_node;
      }
      if (*(int *)&p_Var4[1]._M_next == 0x137) {
        FormatString<char[43]>(&err,(char (*) [43])"Multi-dimensional arrays are not supported");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&err_15,this,Token,4);
        in_R8 = &err;
        Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x956;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseShaderParameter",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x956,in_R8,(char (*) [2])0x2c8293,&err_15);
        std::__cxx11::string::~string((string *)&err_15);
        std::__cxx11::string::~string((string *)&err);
      }
    }
    if (*(int *)&TypeToken._M_node[1]._M_next - 1U < 0xbf) {
      p_Var4 = Token->_M_node;
      if (p_Var4 == (_List_node_base *)this_00) {
        err_15._M_dataplus._M_p._0_1_ = 0x22;
        FormatString<char[40],std::__cxx11::string,char>
                  (&err,(Diligent *)"Unexpected end of file after argument \"",(char (*) [40])Args,
                   &err_15,(char *)in_R8);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&err_15,this,Token,4);
        in_R8 = &err;
        Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x95d;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseShaderParameter",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x95d,in_R8,(char (*) [2])0x2c8293,&err_15);
        std::__cxx11::string::~string((string *)&err_15);
        std::__cxx11::string::~string((string *)&err);
        p_Var4 = Token->_M_node;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &p_Var4[1]._M_prev,":");
      if (bVar2) {
        p_Var4 = Token->_M_node->_M_next;
        Token->_M_node = p_Var4;
        if (p_Var4 == (_List_node_base *)this_00) {
          err_15._M_dataplus._M_p._0_1_ = 0x22;
          FormatString<char[65],std::__cxx11::string,char>
                    (&err,(Diligent *)
                          "Unexpected end of file while looking for semantic for argument \"",
                     (char (*) [65])Args,&err_15,(char *)in_R8);
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&err_15,this,Token,4);
          in_R8 = &err;
          Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x963;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ParseShaderParameter",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x963,in_R8,(char (*) [2])0x2c8293,&err_15);
          std::__cxx11::string::~string((string *)&err_15);
          std::__cxx11::string::~string((string *)&err);
          p_Var4 = Token->_M_node;
        }
        if (*(int *)&p_Var4[1]._M_next != 0x13b) {
          err_15._M_dataplus._M_p._0_1_ = 0x22;
          FormatString<char[32],std::__cxx11::string,char>
                    (&err,(Diligent *)"Missing semantic for argument \"",(char (*) [32])Args,&err_15
                     ,(char *)in_R8);
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&err_15,this,Token,4);
          Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x964;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ParseShaderParameter",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x964,&err,(char (*) [2])0x2c8293,&err_15);
          std::__cxx11::string::~string((string *)&err_15);
          std::__cxx11::string::~string((string *)&err);
          p_Var4 = Token->_M_node;
        }
        std::__cxx11::string::string((string *)&local_70,(string *)&p_Var4[1]._M_prev);
        StrToLower(&err,&local_70);
        std::__cxx11::string::operator=((string *)&ParamInfo->Semantic,(string *)&err);
        std::__cxx11::string::~string((string *)&err);
        std::__cxx11::string::~string((string *)&local_70);
        Token->_M_node = Token->_M_node->_M_next;
      }
    }
  }
  iVar7._M_node = TypeToken._M_node;
  if (0xbe < *(int *)&TypeToken._M_node[1]._M_next - 1U) {
    iVar5 = FindMacroDefinition(this,(string *)&TypeToken._M_node[1]._M_prev);
    if ((iVar5._M_node != (_List_node_base *)this_00) &&
       (Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 iVar5._M_node[5]._M_prev,
       Args_1 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                iVar7._M_node[5]._M_prev)) {
      iVar7 = iVar5;
      TypeToken = iVar5;
    }
    HashMapStringKey::HashMapStringKey
              ((HashMapStringKey *)&err,(Char *)iVar7._M_node[1]._M_prev,false);
    iVar6 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->m_StructDefinitions)._M_h,(key_type *)&err);
    HashMapStringKey::Clear((HashMapStringKey *)&err);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x97c;
      LogError<true,char[37],std::__cxx11::string,char[2]>
                (false,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x97c,(char (*) [37])"Unable to find definition for type \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &iVar7._M_node[1]._M_prev,(char (*) [2])0x2b5820);
    }
    TypeToken._M_node =
         *(_List_node_base **)
          ((long)iVar6.
                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
                 ._M_cur + 0x18);
    if ((*(int *)&TypeToken._M_node[1]._M_next != 0x13b) ||
       (_Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&TypeToken._M_node[1]._M_prev,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&iVar7._M_node[1]._M_prev), !_Var3)) {
      FormatString<char[26],char[77]>
                (&err,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "TypeToken->Type == TokenType::Identifier && TypeToken->Literal == StructName",
                 (char (*) [77])Args_1);
      DebugAssertionFailed
                ((Char *)CONCAT44(err._M_dataplus._M_p._4_4_,err._M_dataplus._M_p._0_4_),
                 "ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x981);
      std::__cxx11::string::~string((string *)&err);
    }
    TypeToken._M_node = (TypeToken._M_node)->_M_next;
    if ((TypeToken._M_node == (_List_node_base *)this_00) ||
       (*(int *)&TypeToken._M_node[1]._M_next != 0x133)) {
      FormatString<char[20]>(&err,(char (*) [20])"Open brace expected");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&err_15,this,&TypeToken,4);
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x987,&err,(char (*) [2])0x2c8293,&err_15);
      std::__cxx11::string::~string((string *)&err_15);
      std::__cxx11::string::~string((string *)&err);
    }
    TypeToken._M_node = (TypeToken._M_node)->_M_next;
    while ((TypeToken._M_node != (_List_node_base *)this_00 &&
           (*(int *)&TypeToken._M_node[1]._M_next != 0x134))) {
      err._M_dataplus._M_p._4_4_ = err._M_dataplus._M_p._4_4_ & 0xffffff00;
      err._M_dataplus._M_p._0_4_ = 0;
      err._M_string_length = (long)&err.field_2 + 8;
      err.field_2._M_allocated_capacity = 0;
      err.field_2._M_local_buf[8] = '\0';
      ParseShaderParameter(this,&TypeToken,(ShaderParameterInfo *)&err);
      err._M_dataplus._M_p._0_1_ = ParamInfo->storageQualifier;
      std::
      vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
      ::emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>
                (&ParamInfo->members,(ShaderParameterInfo *)&err);
      if ((Token->_M_node == (_List_node_base *)this_00) ||
         (*(int *)&TypeToken._M_node[1]._M_next != 0x13e)) {
        FormatString<char[19]>(&err_15,(char (*) [19])"Semicolon expected");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_50,this,&TypeToken,4);
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseShaderParameter",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x99b,&err_15,(char (*) [2])0x2c8293,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&err_15);
      }
      TypeToken._M_node = (TypeToken._M_node)->_M_next;
      ShaderParameterInfo::~ShaderParameterInfo((ShaderParameterInfo *)&err);
    }
    return;
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ParseShaderParameter(TokenListType::iterator& Token, ShaderParameterInfo& ParamInfo)
{
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while parsing argument list");

    if (ParamInfo.SetInterpolationQualifier(Token->Type))
    {
        //          out noperspective float4 Color : SV_Target,
        //              ^
        Token = m_Tokens.erase(Token);
        //          out float4 Color : SV_Target,
        //              ^
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while parsing argument list");
    }

    VERIFY_PARSER_STATE(Token, Token->IsBuiltInType() || Token->Type == TokenType::Identifier,
                        "Missing argument type");
    auto TypeToken = Token;
    ParamInfo.Type = Token->Literal;

    if (ParamInfo.storageQualifier != ShaderParameterInfo::StorageQualifier::Ret)
    {
        ++Token;
        //          out float4 Color : SV_Target,
        //                     ^
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while parsing argument list");
        VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Missing argument name after ", ParamInfo.Type);
        ParamInfo.Name = Token->Literal;

        ++Token;
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");

        if (Token->Type == TokenType::OpenSquareBracket)
        {
            // triangle VSOut In[3]
            //                  ^
            ProcessScope(
                Token, m_Tokens.end(), TokenType::OpenSquareBracket, TokenType::ClosingSquareBracket,
                [&](TokenListType::iterator& tkn, int) {
                    ParamInfo.ArraySize.append(tkn->Delimiter);
                    ParamInfo.ArraySize.append(tkn->Literal);
                    ++tkn;
                } //
            );
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");
            // triangle VSOut In[3],
            //                    ^
            VERIFY_PARSER_STATE(Token, Token->Type == TokenType::ClosingSquareBracket, "Closing staple expected");

            ++Token;
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");
            VERIFY_PARSER_STATE(Token, Token->Type != TokenType::OpenSquareBracket, "Multi-dimensional arrays are not supported");
        }

        if (TypeToken->IsBuiltInType())
        {
            //          out float4 Color : SV_Target,
            //                           ^
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected end of file after argument \"", ParamInfo.Name, '\"');
            if (Token->Literal == ":")
            {
                ++Token;
                //          out float4 Color : SV_Target,
                //                             ^
                VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected end of file while looking for semantic for argument \"", ParamInfo.Name, '\"');
                VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Missing semantic for argument \"", ParamInfo.Name, '\"');
                // Transform to lower case -  semantics are case-insensitive
                ParamInfo.Semantic = StrToLower(Token->Literal);

                ++Token;
                //          out float4 Color : SV_Target,
                //                                      ^
            }
        }
    }

    if (!TypeToken->IsBuiltInType())
    {
        {
            auto DefinedTypeToken = FindMacroDefinition(TypeToken->Literal);
            // Check that the define directive is before the type token
            if (DefinedTypeToken != m_Tokens.end() && DefinedTypeToken->Idx < TypeToken->Idx)
            {
                TypeToken = DefinedTypeToken;
            }
        }
        const auto& StructName = TypeToken->Literal;
        auto        it         = m_StructDefinitions.find(StructName.c_str());
        if (it == m_StructDefinitions.end())
            LOG_ERROR_AND_THROW("Unable to find definition for type \'", StructName, "\'");

        TypeToken = it->second;
        // struct VSOutput
        //        ^
        VERIFY_EXPR(TypeToken->Type == TokenType::Identifier && TypeToken->Literal == StructName);

        ++TypeToken;
        // struct VSOutput
        // {
        // ^
        VERIFY_PARSER_STATE(TypeToken, TypeToken != m_Tokens.end() && TypeToken->Type == TokenType::OpenBrace, "Open brace expected");

        ++TypeToken;
        // struct VSOutput
        // {
        //     float4 f4Position;
        //     ^
        while (TypeToken != m_Tokens.end() && TypeToken->Type != TokenType::ClosingBrace)
        {
            ShaderParameterInfo MemberInfo;
            ParseShaderParameter(TypeToken, MemberInfo);
            // Set storage qualifier after we process the member as otherwise
            // members of a struct with the StorageQualifier::Ret qualifier
            // will not be processed.
            MemberInfo.storageQualifier = ParamInfo.storageQualifier;
            ParamInfo.members.emplace_back(std::move(MemberInfo));
            // struct VSOutput
            // {
            //     float4 f4Position;
            //                      ^
            VERIFY_PARSER_STATE(TypeToken, Token != m_Tokens.end() && TypeToken->Type == TokenType::Semicolon, "Semicolon expected");
            ++TypeToken;
        }
    }
}